

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

bool __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::setText
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this,unsigned_long *start,
          unsigned_long *end)

{
  bool bVar1;
  long lVar2;
  ulong *puVar3;
  string<unsigned_long> s;
  undefined1 local_30 [32];
  
  lVar2 = (long)end - (long)start >> 3;
  puVar3 = start;
  if (lVar2 < 3) {
    for (; puVar3 != end; puVar3 = puVar3 + 1) {
      if ((0x20 < *puVar3) || ((0x100002600U >> (*puVar3 & 0x3f) & 1) == 0)) goto LAB_0060da6f;
    }
    bVar1 = false;
  }
  else {
LAB_0060da6f:
    core::string<unsigned_long>::string<unsigned_long>
              ((string<unsigned_long> *)(local_30 + 0x10),start,(s32)lVar2);
    replaceSpecialCharacters
              ((CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *)local_30,
               (string<unsigned_long> *)this);
    core::string<unsigned_long>::operator=(&this->NodeName,(string<unsigned_long> *)local_30);
    core::string<unsigned_long>::~string((string<unsigned_long> *)local_30);
    this->CurrentNodeType = EXN_TEXT;
    core::string<unsigned_long>::~string((string<unsigned_long> *)(local_30 + 0x10));
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool setText(char_type* start, char_type* end)
	{
		// check if text is more than 2 characters, and if not, check if there is 
		// only white space, so that this text won't be reported
		if (end - start < 3)
		{
			char_type* p = start;
			for(; p != end; ++p)
				if (!isWhiteSpace(*p))
					break;

			if (p == end)
				return false;
		}

		// set current text to the parsed text, and replace xml special characters
		core::string<char_type> s(start, (int)(end - start));
		NodeName = replaceSpecialCharacters(s);

		// current XML node type is text
		CurrentNodeType = EXN_TEXT;

		return true;
	}